

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
OneLevel_InsertFirstNode_Test::~OneLevel_InsertFirstNode_Test(OneLevel_InsertFirstNode_Test *this)

{
  OneLevel_InsertFirstNode_Test *this_local;
  
  ~OneLevel_InsertFirstNode_Test(this);
  operator_delete(this,0x168);
  return;
}

Assistant:

TEST_F (OneLevel, InsertFirstNode) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    EXPECT_FALSE (this->is_found (*index_, "a")); // check the index::empty() function.
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "a");
    std::string const & key = (*itp.first).first;
    EXPECT_EQ ("a", key);
    EXPECT_TRUE (itp.second);
    EXPECT_EQ (1U, index_->size ());
    EXPECT_TRUE (this->is_found (*index_, "a")) << "key \"a\" should be present in the index";
}